

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string * el::base::utils::Str::ltrim(string *str)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar2 = (str->_M_dataplus)._M_p;
  uVar3 = str->_M_string_length;
  pcVar1 = pcVar2 + uVar3;
  pcVar6 = pcVar2;
  if (0 < (long)uVar3 >> 2) {
    pcVar6 = pcVar2 + (uVar3 & 0xfffffffffffffffc);
    lVar5 = ((long)uVar3 >> 2) + 1;
    pcVar7 = pcVar2 + 3;
    do {
      iVar4 = isspace((int)pcVar7[-3]);
      if (iVar4 == 0) {
        pcVar7 = pcVar7 + -3;
        goto LAB_00159d75;
      }
      iVar4 = isspace((int)pcVar7[-2]);
      if (iVar4 == 0) {
        pcVar7 = pcVar7 + -2;
        goto LAB_00159d75;
      }
      iVar4 = isspace((int)pcVar7[-1]);
      if (iVar4 == 0) {
        pcVar7 = pcVar7 + -1;
        goto LAB_00159d75;
      }
      iVar4 = isspace((int)*pcVar7);
      if (iVar4 == 0) goto LAB_00159d75;
      lVar5 = lVar5 + -1;
      pcVar7 = pcVar7 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar1 - (long)pcVar6;
  if (lVar5 == 1) {
LAB_00159d51:
    iVar4 = isspace((int)*pcVar6);
    pcVar7 = pcVar6;
    if (iVar4 != 0) {
      pcVar7 = pcVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_00159d40:
    iVar4 = isspace((int)*pcVar6);
    pcVar7 = pcVar6;
    if (iVar4 != 0) {
      pcVar6 = pcVar6 + 1;
      goto LAB_00159d51;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_00159d8c;
    iVar4 = isspace((int)*pcVar6);
    pcVar7 = pcVar6;
    if (iVar4 != 0) {
      pcVar6 = pcVar6 + 1;
      goto LAB_00159d40;
    }
  }
LAB_00159d75:
  if (pcVar1 != pcVar7) {
    ::std::__cxx11::string::_M_erase((ulong)str,0);
    return str;
  }
LAB_00159d8c:
  str->_M_string_length = 0;
  *pcVar2 = '\0';
  return str;
}

Assistant:

std::string& Str::ltrim(std::string& str) {
  str.erase(str.begin(), std::find_if(str.begin(), str.end(), [](char c) {
    return !std::isspace(c);
  } ));
  return str;
}